

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cc
# Opt level: O3

bool LessThan(string *left,string *right)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = std::__cxx11::string::compare((string *)left);
  if (iVar1 < 0) {
    std::operator+(&local_60,"\"",left);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_60);
    local_c0 = &local_b0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_b0 = *plVar2;
      lStack_a8 = puVar3[3];
    }
    else {
      local_b0 = *plVar2;
      local_c0 = (long *)*puVar3;
    }
    local_b8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c0,(ulong)(right->_M_dataplus)._M_p);
    local_a0 = &local_90;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_90 = *plVar2;
      lStack_88 = puVar3[3];
    }
    else {
      local_90 = *plVar2;
      local_a0 = (long *)*puVar3;
    }
    local_98 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
    paVar7 = &local_40.field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_40.field_2._M_allocated_capacity = *psVar5;
      local_40.field_2._8_8_ = plVar2[3];
      local_40._M_dataplus._M_p = (pointer)paVar7;
    }
    else {
      local_40.field_2._M_allocated_capacity = *psVar5;
      local_40._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_40._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    LogText::Log(&local_40);
    _Var6._M_p = local_40._M_dataplus._M_p;
  }
  else {
    std::operator+(&local_60,"\"",left);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_c0 = &local_b0;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_b0 = *plVar4;
      lStack_a8 = plVar2[3];
    }
    else {
      local_b0 = *plVar4;
      local_c0 = (long *)*plVar2;
    }
    local_b8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c0,(ulong)(right->_M_dataplus)._M_p);
    local_a0 = &local_90;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_90 = *plVar4;
      lStack_88 = plVar2[3];
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar2;
    }
    local_98 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
    paVar7 = &local_80.field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80.field_2._8_8_ = plVar2[3];
      local_80._M_dataplus._M_p = (pointer)paVar7;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_80._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    LogText::Log(&local_80);
    _Var6._M_p = local_80._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar7) {
    operator_delete(_Var6._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool LessThan(const std::string& left, const std::string& right) {
  if (left < right) {
    LogText::Log("\"" + left + "\" < \"" + right + "\"");
    return true;
  } else {
    LogText::Log("\"" + left + "\" >= \"" + right + "\"");
    return false;
  }
}